

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Repetition.hpp
# Opt level: O1

void InstructionSet::x86::Primitive::
     lods<unsigned_char,unsigned_short,(InstructionSet::x86::Repetition)3,InstructionSet::x86::Instruction<false>,PCCompatible::ConcreteMachine<(Analyser::Static::PCCompatible::Target::VideoAdaptor)0>::Context>
               (Instruction<false> *instruction,unsigned_short *eCX,unsigned_short *eSI,uchar *eAX,
               Context *context)

{
  Segments *pSVar1;
  byte bVar2;
  
  if (*eCX != 0) {
    bVar2 = (byte)(instruction->source_data_dest_sib_ >> 10) & 7 | 8;
    pSVar1 = (context->memory).segments_;
    if (bVar2 != 8) {
      if (bVar2 == 9) {
        pSVar1 = (Segments *)&pSVar1->cs_base_;
      }
      else if (bVar2 == 10) {
        pSVar1 = (Segments *)&pSVar1->ss_base_;
      }
      else {
        pSVar1 = (Segments *)&pSVar1->ds_base_;
      }
    }
    *eAX = (context->memory).memory._M_elems[(uint)*eSI + pSVar1->es_base_ & 0xfffff];
    *eSI = *eSI + (short)(context->flags).direction_;
    *eCX = *eCX - 1;
    if (*eCX != 0) {
      (context->flow_controller).should_repeat_ = true;
    }
  }
  return;
}

Assistant:

bool repetition_over(
	const AddressT &eCX
) {
	return repetition != Repetition::None && !eCX;
}